

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

pointer __thiscall
absl::lts_20250127::
InlinedVector<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
::data(InlinedVector<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
       *this)

{
  bool bVar1;
  undefined8 local_28;
  InlinedVector<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
  *this_local;
  
  bVar1 = inlined_vector_internal::
          Storage<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
          ::GetIsAllocated(&this->storage_);
  if (bVar1) {
    local_28 = inlined_vector_internal::
               Storage<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
               ::GetAllocatedData(&this->storage_);
  }
  else {
    local_28 = inlined_vector_internal::
               Storage<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
               ::GetInlinedData(&this->storage_);
  }
  return local_28;
}

Assistant:

pointer data() noexcept ABSL_ATTRIBUTE_LIFETIME_BOUND {
    return storage_.GetIsAllocated() ? storage_.GetAllocatedData()
                                     : storage_.GetInlinedData();
  }